

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::PathDescriptionSyntax::PathDescriptionSyntax
          (PathDescriptionSyntax *this,Token openParen,Token edgeIdentifier,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token polarityOperator,
          Token pathOperator,PathSuffixSyntax *suffix,Token closeParen)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  NameSyntax *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar5 = edgeIdentifier._0_8_;
  uVar6 = openParen._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = PathDescription;
  (this->openParen).kind = (short)uVar6;
  (this->openParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->edgeIdentifier).kind = (short)uVar5;
  (this->edgeIdentifier).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->edgeIdentifier).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->edgeIdentifier).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->edgeIdentifier).info = edgeIdentifier.info;
  SVar2 = (inputs->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(inputs->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent =
       (inputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->inputs).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->inputs).super_SyntaxListBase.childCount = (inputs->super_SyntaxListBase).childCount;
  (this->inputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050ae40;
  sVar1 = (inputs->elements).size_;
  (this->inputs).elements.data_ = (inputs->elements).data_;
  (this->inputs).elements.size_ = sVar1;
  (this->polarityOperator).kind = polarityOperator.kind;
  (this->polarityOperator).field_0x2 = polarityOperator._2_1_;
  (this->polarityOperator).numFlags = (NumericTokenFlags)polarityOperator.numFlags.raw;
  (this->polarityOperator).rawLen = polarityOperator.rawLen;
  (this->polarityOperator).info = polarityOperator.info;
  (this->pathOperator).kind = pathOperator.kind;
  (this->pathOperator).field_0x2 = pathOperator._2_1_;
  (this->pathOperator).numFlags = (NumericTokenFlags)pathOperator.numFlags.raw;
  (this->pathOperator).rawLen = pathOperator.rawLen;
  (this->pathOperator).info = pathOperator.info;
  (this->suffix).ptr = suffix;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->inputs).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pNVar4 = SeparatedSyntaxList<slang::syntax::NameSyntax>::operator[](&this->inputs,index);
      (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar7 >> 1 != index);
    suffix = (this->suffix).ptr;
    if (suffix == (PathSuffixSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::PathSuffixSyntax *>::get() const [T = slang::syntax::PathSuffixSyntax *]"
                );
    }
  }
  (suffix->super_SyntaxNode).parent = &this->super_SyntaxNode;
  return;
}

Assistant:

PathDescriptionSyntax(Token openParen, Token edgeIdentifier, const SeparatedSyntaxList<NameSyntax>& inputs, Token polarityOperator, Token pathOperator, PathSuffixSyntax& suffix, Token closeParen) :
        SyntaxNode(SyntaxKind::PathDescription), openParen(openParen), edgeIdentifier(edgeIdentifier), inputs(inputs), polarityOperator(polarityOperator), pathOperator(pathOperator), suffix(&suffix), closeParen(closeParen) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
        this->suffix->parent = this;
    }